

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationY<float>::apply
          (RotationY<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  float *pfVar2;
  vector<float,_std::allocator<float>_> *vector_00;
  double __x;
  double __x_00;
  double dVar3;
  undefined1 local_40 [8];
  anon_class_24_4_61ab1aa0 f;
  int qubit;
  int offset_local;
  vector<float,_std::allocator<float>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  RotationY<float> *this_local;
  
  vector_00 = vector;
  f._20_4_ = offset;
  iVar1 = (*(this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  f.s2 = (float)(iVar1 + f._20_4_);
  __x_00 = QRotationGate1<float>::cos(&this->super_QRotationGate1<float>,__x);
  dVar3 = QRotationGate1<float>::sin(&this->super_QRotationGate1<float>,__x_00);
  pfVar2 = std::vector<float,_std::allocator<float>_>::data(vector);
  lambda_RotationY<float,float>
            ((anon_class_24_4_61ab1aa0 *)local_40,(qgates *)(ulong)(uint)(int)(char)op,(Op)pfVar2,
             SUB84(__x_00,0),SUB84(dVar3,0),(float *)vector_00);
  apply2<qclab::qgates::lambda_RotationY<float,float>(qclab::Op,float,float,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,(int)f.s2,(anon_class_24_4_61ab1aa0 *)local_40);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }